

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_boundary.cpp
# Opt level: O2

void segment_operator(void)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"",&local_49);
  std::__cxx11::string::string((string *)&local_48,"a",&local_4a);
  test_op(&local_28,&local_48,-1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"",&local_49);
  std::__cxx11::string::string((string *)&local_48,"",&local_4a);
  test_op(&local_28,&local_48,0);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"aa",&local_49);
  std::__cxx11::string::string((string *)&local_48,"aaa",&local_4a);
  test_op(&local_28,&local_48,-1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"aa",&local_49);
  std::__cxx11::string::string((string *)&local_48,"ab",&local_4a);
  test_op(&local_28,&local_48,-1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void segment_operator()
{
    test_op("","a",-1);
    test_op("","",0);
    test_op("aa","aaa",-1);
    test_op("aa","ab",-1);
}